

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_push_constant_block(CompilerGLSL *this,SPIRVariable *var)

{
  size_type sVar1;
  key_type local_14;
  
  sVar1 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->flattened_buffer_blocks)._M_h,&local_14);
  if (sVar1 == 0) {
    if ((this->options).vulkan_semantics == true) {
      (*(this->super_Compiler)._vptr_Compiler[0x21])(this,var);
    }
    else if ((this->options).emit_push_constant_as_uniform_buffer == true) {
      emit_buffer_block_native(this,var);
    }
    else {
      emit_push_constant_block_glsl(this,var);
    }
  }
  else {
    emit_buffer_block_flattened(this,var);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_push_constant_block(const SPIRVariable &var)
{
	if (flattened_buffer_blocks.count(var.self))
		emit_buffer_block_flattened(var);
	else if (options.vulkan_semantics)
		emit_push_constant_block_vulkan(var);
	else if (options.emit_push_constant_as_uniform_buffer)
		emit_buffer_block_native(var);
	else
		emit_push_constant_block_glsl(var);
}